

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

bool __thiscall
Bitmap_Operation::BitmapCoreHeader::validate(BitmapCoreHeader *this,BitmapFileHeader *header)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  long in_RSI;
  long in_RDI;
  int iVar4;
  undefined3 uVar5;
  int in_stack_ffffffffffffff94;
  short local_40;
  int local_28;
  
  bVar3 = false;
  bVar2 = false;
  if (((*(short *)(in_RDI + 0x12) == 8) || (*(short *)(in_RDI + 0x12) == 0x18)) ||
     (in_stack_ffffffffffffff94 = CONCAT13(1,(int3)in_stack_ffffffffffffff94),
     *(short *)(in_RDI + 0x12) == 0x20)) {
    uVar5 = (undefined3)in_stack_ffffffffffffff94;
    in_stack_ffffffffffffff94 = CONCAT13(1,uVar5);
    if ((*(short *)(in_RDI + 0xc) != 0) &&
       (in_stack_ffffffffffffff94 = CONCAT13(1,uVar5), *(short *)(in_RDI + 0xe) != 0)) {
      iVar4 = *(int *)(in_RDI + 8);
      BitmapCoreHeader((BitmapCoreHeader *)CONCAT44(in_stack_ffffffffffffff94,iVar4));
      bVar3 = true;
      in_stack_ffffffffffffff94 = CONCAT13(1,(int3)in_stack_ffffffffffffff94);
      if (iVar4 == local_28) {
        sVar1 = *(short *)(in_RDI + 0x10);
        BitmapCoreHeader((BitmapCoreHeader *)CONCAT44(in_stack_ffffffffffffff94,iVar4));
        bVar2 = true;
        in_stack_ffffffffffffff94 = 0x1000000;
        if (sVar1 == local_40) {
          in_stack_ffffffffffffff94 =
               (uint)(*(uint *)(in_RSI + 0xc) <
                     (uint)(*(int *)(in_RDI + 0x14) + *(int *)(in_RSI + 0x10))) << 0x18;
        }
      }
    }
  }
  if (bVar2) {
    ~BitmapCoreHeader((BitmapCoreHeader *)0x130837);
  }
  if (bVar3) {
    ~BitmapCoreHeader((BitmapCoreHeader *)0x13084a);
  }
  return SUB41((uint)in_stack_ffffffffffffff94 >> 0x18,0);
}

Assistant:

virtual bool validate( const BitmapFileHeader & header )
        {
            return !(bcBitCount == 8u || bcBitCount == 24u || bcBitCount == 32u) ||
                bcWidth == 0 || bcHeight == 0 || bcSize != BitmapCoreHeader().bcSize ||
                bcPlanes != BitmapCoreHeader().bcPlanes || header.bfOffBits < overallSize + header.overallSize;
        }